

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O0

string * cmStrCat<char_const(&)[12],std::__cxx11::string&,std::__cxx11::string,char_const(&)[6],std::__cxx11::string_const&,char_const(&)[52]>
                   (string *__return_storage_ptr__,char (*a) [12],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
                   char (*args_1) [6],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
                   char (*args_3) [52])

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  cmAlphaNum local_228;
  cmAlphaNum local_1f0;
  cmAlphaNum local_1b8;
  cmAlphaNum local_180;
  cmAlphaNum local_148;
  cmAlphaNum local_110;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_d8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_c0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_a8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_90;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_78;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_60;
  iterator local_48;
  undefined8 local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_2;
  char (*args_local_1) [6];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b_local;
  char (*a_local) [12];
  
  local_38 = args_2;
  args_local_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1;
  args_local_1 = (char (*) [6])args;
  args_local = b;
  b_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)a;
  a_local = (char (*) [12])__return_storage_ptr__;
  cmAlphaNum::cmAlphaNum(&local_110,*a);
  cmStrCat<char_const(&)[12],std::__cxx11::string&,std::__cxx11::string,char_const(&)[6],std::__cxx11::string_const&,char_const(&)[52]>(char_const(&)[12],std::__cxx11::string&,std::__cxx11::string&&,char_const(&)[6],std::__cxx11::string_const&,char_const(&)[52])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&local_d8,
             &cmStrCat<char_const(&)[12],std::__cxx11::string&,std::__cxx11::string,char_const(&)[6],std::__cxx11::string_const&,char_const(&)[52]>(char_const&[],std::__cxx11::string&,std::__cxx11::string&&,char_const&[],std::__cxx11::string_const&,char_const&[])
              ::makePair,&local_110);
  cmAlphaNum::cmAlphaNum(&local_148,args_local);
  cmStrCat<char_const(&)[12],std::__cxx11::string&,std::__cxx11::string,char_const(&)[6],std::__cxx11::string_const&,char_const(&)[52]>(char_const(&)[12],std::__cxx11::string&,std::__cxx11::string&&,char_const(&)[6],std::__cxx11::string_const&,char_const(&)[52])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_c0,
             &cmStrCat<char_const(&)[12],std::__cxx11::string&,std::__cxx11::string,char_const(&)[6],std::__cxx11::string_const&,char_const(&)[52]>(char_const&[],std::__cxx11::string&,std::__cxx11::string&&,char_const&[],std::__cxx11::string_const&,char_const&[])
              ::makePair,&local_148);
  cmAlphaNum::cmAlphaNum(&local_180,(string *)args_local_1);
  cmStrCat<char_const(&)[12],std::__cxx11::string&,std::__cxx11::string,char_const(&)[6],std::__cxx11::string_const&,char_const(&)[52]>(char_const(&)[12],std::__cxx11::string&,std::__cxx11::string&&,char_const(&)[6],std::__cxx11::string_const&,char_const(&)[52])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_a8,
             &cmStrCat<char_const(&)[12],std::__cxx11::string&,std::__cxx11::string,char_const(&)[6],std::__cxx11::string_const&,char_const(&)[52]>(char_const&[],std::__cxx11::string&,std::__cxx11::string&&,char_const&[],std::__cxx11::string_const&,char_const&[])
              ::makePair,&local_180);
  cmAlphaNum::cmAlphaNum(&local_1b8,(char *)args_local_2);
  cmStrCat<char_const(&)[12],std::__cxx11::string&,std::__cxx11::string,char_const(&)[6],std::__cxx11::string_const&,char_const(&)[52]>(char_const(&)[12],std::__cxx11::string&,std::__cxx11::string&&,char_const(&)[6],std::__cxx11::string_const&,char_const(&)[52])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_90,
             &cmStrCat<char_const(&)[12],std::__cxx11::string&,std::__cxx11::string,char_const(&)[6],std::__cxx11::string_const&,char_const(&)[52]>(char_const&[],std::__cxx11::string&,std::__cxx11::string&&,char_const&[],std::__cxx11::string_const&,char_const&[])
              ::makePair,&local_1b8);
  cmAlphaNum::cmAlphaNum(&local_1f0,local_38);
  cmStrCat<char_const(&)[12],std::__cxx11::string&,std::__cxx11::string,char_const(&)[6],std::__cxx11::string_const&,char_const(&)[52]>(char_const(&)[12],std::__cxx11::string&,std::__cxx11::string&&,char_const(&)[6],std::__cxx11::string_const&,char_const(&)[52])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_78,
             &cmStrCat<char_const(&)[12],std::__cxx11::string&,std::__cxx11::string,char_const(&)[6],std::__cxx11::string_const&,char_const(&)[52]>(char_const&[],std::__cxx11::string&,std::__cxx11::string&&,char_const&[],std::__cxx11::string_const&,char_const&[])
              ::makePair,&local_1f0);
  cmAlphaNum::cmAlphaNum(&local_228,*args_3);
  cmStrCat<char_const(&)[12],std::__cxx11::string&,std::__cxx11::string,char_const(&)[6],std::__cxx11::string_const&,char_const(&)[52]>(char_const(&)[12],std::__cxx11::string&,std::__cxx11::string&&,char_const(&)[6],std::__cxx11::string_const&,char_const(&)[52])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_60,
             &cmStrCat<char_const(&)[12],std::__cxx11::string&,std::__cxx11::string,char_const(&)[6],std::__cxx11::string_const&,char_const(&)[52]>(char_const&[],std::__cxx11::string&,std::__cxx11::string&&,char_const&[],std::__cxx11::string_const&,char_const&[])
              ::makePair,&local_228);
  local_48 = &local_d8;
  local_40 = 6;
  views._M_len = 6;
  views._M_array = local_48;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}